

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

QModelIndex * __thiscall
QListView::moveCursor
          (QModelIndex *__return_storage_ptr__,QListView *this,CursorAction cursorAction,
          KeyboardModifiers modifiers)

{
  Flow FVar1;
  QListViewPrivate *this_00;
  QSize QVar2;
  QWidgetData *pQVar3;
  Representation RVar4;
  ulong uVar5;
  QArrayData *pQVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  LayoutDirection LVar10;
  Representation RVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  undefined8 uVar15;
  QModelIndex *pQVar16;
  QAbstractItemModel *pQVar17;
  Representation RVar18;
  int iVar19;
  int iVar20;
  long in_FS_OFFSET;
  undefined4 uVar21;
  undefined4 uVar22;
  QRect QVar23;
  QRect QVar24;
  undefined1 local_e8 [8];
  undefined1 *puStack_e0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_d8;
  QArrayData *local_c8;
  undefined1 *puStack_c0;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_b8;
  undefined8 local_a8;
  Representation local_a0;
  Representation RStack_9c;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_78;
  QArrayData *local_68;
  undefined1 *puStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QListViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  local_78.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  uStack_80 = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex((QModelIndex *)&local_88,(QAbstractItemView *)this);
  if ((((int)local_88 < 0) || ((long)local_88 < 0)) || (local_78.ptr == (QAbstractItemModel *)0x0))
  {
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_68,&(this_00->super_QAbstractItemViewPrivate).root);
    iVar9 = (**(code **)(*(long *)pQVar17 + 0x78))(pQVar17,(QModelIndex *)&local_68);
    iVar19 = -1;
    if (0 < iVar9) {
      iVar20 = 0;
      do {
        bVar8 = QListViewPrivate::isHiddenOrDisabled(this_00,iVar20);
        iVar19 = iVar20;
        if (!bVar8) break;
        iVar20 = iVar20 + 1;
        iVar19 = -1;
      } while (iVar9 != iVar20);
    }
    if (iVar19 == -1) {
      __return_storage_ptr__->r = -1;
      __return_storage_ptr__->c = -1;
      __return_storage_ptr__->i = 0;
      (__return_storage_ptr__->m).ptr = (QAbstractItemModel *)0x0;
      goto LAB_005771f2;
    }
LAB_00576ec1:
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar9 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_68,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar13 = *(long *)pQVar17;
LAB_00576f4e:
    (**(code **)(lVar13 + 0x60))(__return_storage_ptr__,pQVar17,iVar19,iVar9,&local_68);
    goto LAB_005771f2;
  }
  FVar1 = this_00->flow;
  if ((cursorAction == MoveLeft && FVar1 == LeftToRight) ||
     ((FVar1 == TopToBottom && ((cursorAction == MovePrevious || (cursorAction == MoveUp)))))) {
    iVar9 = (int)local_88;
    if ((int)local_88 < 1) {
      iVar19 = (int)local_88 + -1;
    }
    else {
      do {
        iVar19 = iVar9 + -1;
        bVar8 = QListViewPrivate::isHiddenOrDisabled(this_00,iVar19);
        if (!bVar8) goto LAB_00576f0c;
        iVar19 = iVar9 + -1;
        bVar8 = 0 < iVar9;
        iVar9 = iVar19;
      } while (iVar19 != 0 && bVar8);
      iVar19 = -1;
    }
LAB_00576f0c:
    if (iVar19 == -1) goto LAB_005771de;
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar9 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_68,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar13 = *(long *)pQVar17;
    goto LAB_00576f4e;
  }
  if ((cursorAction == MoveRight && FVar1 == LeftToRight) ||
     ((FVar1 == TopToBottom && ((cursorAction == MoveNext || (cursorAction == MoveDown)))))) {
    iVar20 = (int)local_88 + 1;
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_68,&(this_00->super_QAbstractItemViewPrivate).root);
    iVar9 = (**(code **)(*(long *)pQVar17 + 0x78))(pQVar17,(QModelIndex *)&local_68);
    iVar19 = -1;
    if (iVar20 < iVar9) {
      do {
        bVar8 = QListViewPrivate::isHiddenOrDisabled(this_00,iVar20);
        iVar19 = iVar20;
        if (!bVar8) break;
        iVar20 = iVar20 + 1;
        iVar19 = -1;
      } while (iVar9 != iVar20);
    }
    if (iVar19 != -1) goto LAB_00576ec1;
LAB_005771de:
    (__return_storage_ptr__->m).ptr = local_78.ptr;
    *(QArrayData **)__return_storage_ptr__ = local_88;
    __return_storage_ptr__->i = (quintptr)uStack_80;
    goto LAB_005771f2;
  }
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QVar23 = QListViewPrivate::rectForIndex
                     (*(QListViewPrivate **)
                       &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                        super_QWidget.field_0x8,(QModelIndex *)&local_88);
  local_98._0_4_ = QVar23.x1.m_i;
  local_98._4_4_ = QVar23.y1.m_i;
  local_98._8_4_ = QVar23.x2.m_i;
  local_98._12_4_ = QVar23.y2.m_i;
  auVar7 = local_98;
  local_98._0_8_ = QVar23._0_8_;
  local_a8 = local_98._0_8_;
  uVar12 = local_a8;
  local_98._8_8_ = QVar23._8_8_;
  local_a0.m_i = local_98._8_4_;
  RStack_9c.m_i = local_98._12_4_;
  uVar15 = _local_a0;
  local_a8._0_4_ = QVar23.x1.m_i;
  local_a0 = QVar23.x2.m_i;
  local_a8 = uVar12;
  _local_a0 = uVar15;
  local_98 = auVar7;
  if (local_a0.m_i < local_a8._0_4_) {
LAB_0057721e:
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar9 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_68,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar13 = *(long *)pQVar17;
    iVar19 = 0;
    goto LAB_00576f4e;
  }
  local_a8._4_4_ = QVar23.y1.m_i;
  RStack_9c = QVar23.y2.m_i;
  if (RStack_9c.m_i < local_a8._4_4_) goto LAB_0057721e;
  QVar2 = this_00->grid;
  if (((ulong)QVar2 & 0x8000000080000000) == 0) {
    RStack_9c.m_i = local_a8._4_4_ + QVar2.ht.m_i.m_i + -1;
    local_a0.m_i = local_a8._0_4_ + QVar2.wd.m_i.m_i + -1;
  }
  QVar2 = this_00->commonListView->contentsSize;
  local_68 = (QArrayData *)0x0;
  puStack_60 = (undefined1 *)0x0;
  local_58.ptr = (QAbstractItemModel *)0x0;
  RVar18 = QVar2.ht.m_i;
  switch(cursorAction) {
  case MoveUp:
  case MovePrevious:
    do {
      uVar5 = local_a8;
      iVar9 = local_a8._4_4_;
      iVar19 = ~RStack_9c.m_i + local_a8._4_4_ * 2;
      local_a8 = CONCAT44(iVar19,local_a8._0_4_);
      RStack_9c.m_i = iVar9 + -1;
      uVar12 = local_a8;
      auVar7 = local_98;
      if (iVar9 + -1 < 1) goto switchD_0057703a_default;
      if (iVar19 < 0) {
        local_a8 = uVar5 & 0xffffffff;
      }
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      LVar10 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      _local_e8 = QRect::normalized();
      uVar12 = local_e8;
      if (LVar10 == RightToLeft) {
        pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar9 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1;
        iVar19 = (this_00->commonListView->contentsSize).wd.m_i;
        if (iVar9 <= iVar19) {
          iVar9 = iVar19;
        }
        uVar14 = ~local_e8._8_4_ + iVar9;
        puStack_e0 = (undefined1 *)
                     ((ulong)((local_e8._8_4_ - local_e8._0_4_) + uVar14) |
                     local_e8._8_8_ & 0xffffffff00000000);
        local_e8 = (undefined1  [8])((ulong)uVar14 | uVar12 & 0xffffffff00000000);
      }
      (*this_00->commonListView->_vptr_QCommonListViewBase[7])
                (&local_c8,this_00->commonListView,local_e8);
      pQVar6 = local_68;
      local_58.ptr = local_b8.ptr;
      puStack_60 = puStack_c0;
      local_68 = local_c8;
      local_b8.ptr = (QAbstractItemModel *)0x0;
      local_c8 = (QArrayData *)0x0;
      puStack_c0 = (undefined1 *)0x0;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,0x18,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,0x18,0x10);
        }
      }
      QListViewPrivate::removeCurrentAndDisabled
                (this_00,(QList<QModelIndex> *)&local_68,(QModelIndex *)&local_88);
    } while (local_58.ptr == (QAbstractItemModel *)0x0);
    break;
  case MoveDown:
  case MoveNext:
    do {
      iVar19 = RStack_9c.m_i + 1;
      iVar9 = iVar19 - local_a8._4_4_;
      local_a8 = CONCAT44(iVar19,local_a8._0_4_);
      RVar11.m_i = iVar9 + RStack_9c.m_i;
      RStack_9c.m_i = RVar11.m_i;
      uVar12 = local_a8;
      auVar7 = local_98;
      if (RVar18.m_i <= iVar19) goto switchD_0057703a_default;
      if (RVar18.m_i < RVar11.m_i) {
        RStack_9c.m_i = RVar18.m_i;
      }
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      LVar10 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      _local_e8 = QRect::normalized();
      uVar12 = local_e8;
      if (LVar10 == RightToLeft) {
        pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar9 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1;
        iVar19 = (this_00->commonListView->contentsSize).wd.m_i;
        if (iVar9 <= iVar19) {
          iVar9 = iVar19;
        }
        uVar14 = ~local_e8._8_4_ + iVar9;
        puStack_e0 = (undefined1 *)
                     ((ulong)((local_e8._8_4_ - local_e8._0_4_) + uVar14) |
                     local_e8._8_8_ & 0xffffffff00000000);
        local_e8 = (undefined1  [8])((ulong)uVar14 | uVar12 & 0xffffffff00000000);
      }
      (*this_00->commonListView->_vptr_QCommonListViewBase[7])
                (&local_c8,this_00->commonListView,local_e8);
      pQVar6 = local_68;
      local_58.ptr = local_b8.ptr;
      puStack_60 = puStack_c0;
      local_68 = local_c8;
      local_b8.ptr = (QAbstractItemModel *)0x0;
      local_c8 = (QArrayData *)0x0;
      puStack_c0 = (undefined1 *)0x0;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,0x18,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,0x18,0x10);
        }
      }
      QListViewPrivate::removeCurrentAndDisabled
                (this_00,(QList<QModelIndex> *)&local_68,(QModelIndex *)&local_88);
    } while (local_58.ptr == (QAbstractItemModel *)0x0);
    break;
  case MoveLeft:
    do {
      iVar9 = local_a8._0_4_;
      iVar19 = ~local_a0.m_i + local_a8._0_4_ * 2;
      local_a8 = CONCAT44(local_a8._4_4_,iVar19);
      local_a0.m_i = iVar9 + -1;
      uVar12 = local_a8;
      auVar7 = local_98;
      if (iVar9 + -1 < 1) goto switchD_0057703a_default;
      if (iVar19 < 0) {
        local_a8 = (ulong)(uint)local_a8._4_4_ << 0x20;
      }
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      LVar10 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      _local_e8 = QRect::normalized();
      uVar12 = local_e8;
      if (LVar10 == RightToLeft) {
        pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar9 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1;
        iVar19 = (this_00->commonListView->contentsSize).wd.m_i;
        if (iVar9 <= iVar19) {
          iVar9 = iVar19;
        }
        uVar14 = ~local_e8._8_4_ + iVar9;
        puStack_e0 = (undefined1 *)
                     ((ulong)((local_e8._8_4_ - local_e8._0_4_) + uVar14) |
                     local_e8._8_8_ & 0xffffffff00000000);
        local_e8 = (undefined1  [8])((ulong)uVar14 | uVar12 & 0xffffffff00000000);
      }
      (*this_00->commonListView->_vptr_QCommonListViewBase[7])
                (&local_c8,this_00->commonListView,local_e8);
      pQVar6 = local_68;
      local_58.ptr = local_b8.ptr;
      puStack_60 = puStack_c0;
      local_68 = local_c8;
      local_b8.ptr = (QAbstractItemModel *)0x0;
      local_c8 = (QArrayData *)0x0;
      puStack_c0 = (undefined1 *)0x0;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,0x18,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,0x18,0x10);
        }
      }
      QListViewPrivate::removeCurrentAndDisabled
                (this_00,(QList<QModelIndex> *)&local_68,(QModelIndex *)&local_88);
    } while (local_58.ptr == (QAbstractItemModel *)0x0);
    break;
  case MoveRight:
    do {
      iVar19 = local_a0.m_i + 1;
      iVar9 = iVar19 - local_a8._0_4_;
      local_a8 = CONCAT44(local_a8._4_4_,iVar19);
      RVar11.m_i = iVar9 + local_a0.m_i;
      local_a0.m_i = RVar11.m_i;
      RVar18 = QVar2.wd.m_i;
      uVar12 = local_a8;
      auVar7 = local_98;
      if (RVar18.m_i <= iVar19) goto switchD_0057703a_default;
      if (RVar18.m_i < RVar11.m_i) {
        local_a0.m_i = RVar18.m_i;
      }
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      local_e8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
      LVar10 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      _local_e8 = QRect::normalized();
      uVar12 = local_e8;
      if (LVar10 == RightToLeft) {
        pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar9 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1;
        iVar19 = (this_00->commonListView->contentsSize).wd.m_i;
        if (iVar9 <= iVar19) {
          iVar9 = iVar19;
        }
        uVar14 = ~local_e8._8_4_ + iVar9;
        puStack_e0 = (undefined1 *)
                     ((ulong)((local_e8._8_4_ - local_e8._0_4_) + uVar14) |
                     local_e8._8_8_ & 0xffffffff00000000);
        local_e8 = (undefined1  [8])((ulong)uVar14 | uVar12 & 0xffffffff00000000);
      }
      (*this_00->commonListView->_vptr_QCommonListViewBase[7])
                (&local_c8,this_00->commonListView,local_e8);
      pQVar6 = local_68;
      local_58.ptr = local_b8.ptr;
      puStack_60 = puStack_c0;
      local_68 = local_c8;
      local_b8.ptr = (QAbstractItemModel *)0x0;
      local_c8 = (QArrayData *)0x0;
      puStack_c0 = (undefined1 *)0x0;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,0x18,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,0x18,0x10);
        }
      }
      QListViewPrivate::removeCurrentAndDisabled
                (this_00,(QList<QModelIndex> *)&local_68,(QModelIndex *)&local_88);
    } while (local_58.ptr == (QAbstractItemModel *)0x0);
    break;
  case MoveHome:
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar19 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_c8,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar13 = *(long *)pQVar17;
    iVar9 = 0;
    goto LAB_00577a1d;
  case MoveEnd:
    pQVar17 = (this_00->super_QAbstractItemViewPrivate).model;
    iVar9 = this_00->commonListView->batchStartRow + -1;
    iVar19 = this_00->column;
    QPersistentModelIndex::operator_cast_to_QModelIndex
              ((QModelIndex *)&local_c8,&(this_00->super_QAbstractItemViewPrivate).root);
    lVar13 = *(long *)pQVar17;
LAB_00577a1d:
    (**(code **)(lVar13 + 0x60))(__return_storage_ptr__,pQVar17,iVar9,iVar19,&local_c8);
    goto LAB_00577c84;
  case MovePageUp:
    pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar19 = ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1;
    if ((RStack_9c.m_i - local_a8._4_4_) + 1 < iVar19) {
      iVar20 = local_a8._4_4_ - iVar19;
      iVar9 = iVar20 + 1;
      RStack_9c.m_i = (RStack_9c.m_i - iVar19) + 1;
      local_a8 = CONCAT44(iVar9,local_a8._0_4_);
      if (iVar9 < RStack_9c.m_i - iVar20) {
        local_a8 = local_98._0_8_ & 0xffffffff;
        RStack_9c.m_i = 1;
      }
      pQVar16 = (QModelIndex *)&local_c8;
      local_b8.ptr = local_78.ptr;
      local_c8 = local_88;
      puStack_c0 = (undefined1 *)uStack_80;
      while( true ) {
        if (local_58.ptr != (QAbstractItemModel *)0x0) {
          QVar23 = QListViewPrivate::rectForIndex
                             (*(QListViewPrivate **)
                               &(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                super_QFrame.super_QWidget.field_0x8,pQVar16);
          QVar24 = QListViewPrivate::rectForIndex
                             (*(QListViewPrivate **)
                               &(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                super_QFrame.super_QWidget.field_0x8,(QModelIndex *)&local_88);
          pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          if ((~(pQVar3->crect).y2.m_i + QVar24.y2.m_i.m_i + (pQVar3->crect).y1.m_i <
               QVar23.y1.m_i.m_i) && (0 < local_a8._4_4_)) goto LAB_00577cd5;
        }
        local_a8 = CONCAT44(local_a8._4_4_ + 1,local_a8._0_4_);
        RVar11.m_i = RStack_9c.m_i;
        RStack_9c.m_i = RStack_9c.m_i + 1;
        if (0x7ffffffe < (uint)RVar11.m_i) break;
        if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
           ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
          QAbstractItemViewPrivate::interruptDelayedItemsLayout
                    (&this_00->super_QAbstractItemViewPrivate);
          (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                   super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                   super_QWidgetPrivate.field_0x8 + 0x220))();
        }
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        LVar10 = QWidget::layoutDirection
                           (*(QWidget **)
                             &(this_00->super_QAbstractItemViewPrivate).
                              super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                              super_QWidgetPrivate.field_0x8);
        local_48 = QRect::normalized();
        uVar12 = local_48._0_8_;
        if (LVar10 == RightToLeft) {
          pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                   viewport)->data;
          iVar9 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1;
          iVar19 = (this_00->commonListView->contentsSize).wd.m_i;
          if (iVar9 <= iVar19) {
            iVar9 = iVar19;
          }
          uVar14 = ~local_48._8_4_ + iVar9;
          local_48._8_8_ =
               (ulong)((local_48._8_4_ - local_48._0_4_) + uVar14) |
               local_48._8_8_ & 0xffffffff00000000;
          local_48._0_8_ = (ulong)uVar14 | uVar12 & 0xffffffff00000000;
        }
        (*this_00->commonListView->_vptr_QCommonListViewBase[7])
                  ((QModelIndex *)local_e8,this_00->commonListView,local_48);
        pQVar6 = local_68;
        local_58.ptr = local_d8.ptr;
        puStack_60 = puStack_e0;
        local_68 = (QArrayData *)local_e8;
        local_d8.ptr = (QAbstractItemModel *)0x0;
        local_e8 = (undefined1  [8])0x0;
        puStack_e0 = (undefined1 *)0x0;
        if (pQVar6 != (QArrayData *)0x0) {
          LOCK();
          (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar6,0x18,0x10);
          }
        }
        if (local_e8 != (undefined1  [8])0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_e8,0x18,0x10);
          }
        }
        QListViewPrivate::closestIndex
                  ((QModelIndex *)local_e8,this_00,(QRect *)local_98,(QList<QModelIndex> *)&local_68
                  );
        local_b8.ptr = local_d8.ptr;
        local_c8 = (QArrayData *)local_e8;
        puStack_c0 = puStack_e0;
      }
      pQVar16 = (QModelIndex *)&local_88;
LAB_00577cd5:
      (__return_storage_ptr__->m).ptr = (pQVar16->m).ptr;
      iVar19 = pQVar16->r;
      iVar9 = pQVar16->c;
      uVar21 = (undefined4)pQVar16->i;
      uVar22 = *(undefined4 *)((long)&pQVar16->i + 4);
      goto LAB_005779e0;
    }
    lVar13 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                       super_QWidget;
    uVar15 = 0;
LAB_00577c7c:
    (**(code **)(lVar13 + 0x2a8))
              (__return_storage_ptr__,this,uVar15,
               modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
               super_QFlagsStorage<Qt::KeyboardModifier>.i);
    goto LAB_00577c84;
  case MovePageDown:
    pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    iVar19 = ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1;
    if (iVar19 <= (RStack_9c.m_i - local_a8._4_4_) + 1) {
      lVar13 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                         super_QWidget;
      uVar15 = 1;
      goto LAB_00577c7c;
    }
    RVar11.m_i = RStack_9c.m_i + iVar19 + -1;
    RVar4.m_i = local_a8._4_4_ + iVar19;
    if ((RVar18.m_i + local_a8._4_4_ + -1) - RStack_9c.m_i < RVar11.m_i) {
      RVar11.m_i = RVar18.m_i;
      RVar4.m_i = RVar18.m_i;
    }
    RStack_9c.m_i = RVar11.m_i;
    local_a8 = CONCAT44(RVar4.m_i + -1,local_a8._0_4_);
    pQVar16 = (QModelIndex *)&local_c8;
    local_b8.ptr = local_78.ptr;
    local_c8 = local_88;
    puStack_c0 = (undefined1 *)uStack_80;
    while( true ) {
      if (local_58.ptr != (QAbstractItemModel *)0x0) {
        QVar23 = QListViewPrivate::rectForIndex
                           (*(QListViewPrivate **)
                             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame
                              .super_QWidget.field_0x8,pQVar16);
        pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar19 = (pQVar3->crect).y2.m_i;
        iVar9 = (pQVar3->crect).y1.m_i;
        QVar24 = QListViewPrivate::rectForIndex
                           (*(QListViewPrivate **)
                             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame
                              .super_QWidget.field_0x8,(QModelIndex *)&local_88);
        if ((QVar23.y2.m_i.m_i < QVar24.y1.m_i.m_i + (iVar19 - iVar9) + 1) &&
           (RStack_9c.m_i <= RVar18.m_i)) goto LAB_00577cbf;
      }
      iVar19 = local_a8._4_4_ + -1;
      local_a8 = CONCAT44(iVar19,local_a8._0_4_);
      RStack_9c.m_i = RStack_9c.m_i + -1;
      if (RVar18.m_i <= iVar19) break;
      if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout == true) &&
         ((this_00->super_QAbstractItemViewPrivate).state != CollapsingState)) {
        QAbstractItemViewPrivate::interruptDelayedItemsLayout
                  (&this_00->super_QAbstractItemViewPrivate);
        (**(code **)(**(long **)&(this_00->super_QAbstractItemViewPrivate).
                                 super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      LVar10 = QWidget::layoutDirection
                         (*(QWidget **)
                           &(this_00->super_QAbstractItemViewPrivate).
                            super_QAbstractScrollAreaPrivate.super_QFramePrivate.
                            super_QWidgetPrivate.field_0x8);
      local_48 = QRect::normalized();
      uVar12 = local_48._0_8_;
      if (LVar10 == RightToLeft) {
        pQVar3 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                 viewport)->data;
        iVar9 = ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1;
        iVar19 = (this_00->commonListView->contentsSize).wd.m_i;
        if (iVar9 <= iVar19) {
          iVar9 = iVar19;
        }
        uVar14 = ~local_48._8_4_ + iVar9;
        local_48._8_8_ =
             (ulong)((local_48._8_4_ - local_48._0_4_) + uVar14) |
             local_48._8_8_ & 0xffffffff00000000;
        local_48._0_8_ = (ulong)uVar14 | uVar12 & 0xffffffff00000000;
      }
      (*this_00->commonListView->_vptr_QCommonListViewBase[7])
                ((QModelIndex *)local_e8,this_00->commonListView,local_48);
      pQVar6 = local_68;
      local_58.ptr = local_d8.ptr;
      puStack_60 = puStack_e0;
      local_68 = (QArrayData *)local_e8;
      local_d8.ptr = (QAbstractItemModel *)0x0;
      local_e8 = (undefined1  [8])0x0;
      puStack_e0 = (undefined1 *)0x0;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(pQVar6,0x18,0x10);
        }
      }
      if (local_e8 != (undefined1  [8])0x0) {
        LOCK();
        (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)local_e8)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_e8,0x18,0x10);
        }
      }
      QListViewPrivate::closestIndex
                ((QModelIndex *)local_e8,this_00,(QRect *)local_98,(QList<QModelIndex> *)&local_68);
      local_b8.ptr = local_d8.ptr;
      local_c8 = (QArrayData *)local_e8;
      puStack_c0 = puStack_e0;
    }
    pQVar16 = (QModelIndex *)&local_88;
LAB_00577cbf:
    (__return_storage_ptr__->m).ptr = (pQVar16->m).ptr;
    iVar19 = pQVar16->r;
    iVar9 = pQVar16->c;
    uVar21 = (undefined4)pQVar16->i;
    uVar22 = *(undefined4 *)((long)&pQVar16->i + 4);
    goto LAB_005779e0;
  default:
switchD_0057703a_default:
    local_98 = auVar7;
    local_a8 = uVar12;
    (__return_storage_ptr__->m).ptr = local_78.ptr;
    iVar19 = (int)local_88;
    iVar9 = local_88._4_4_;
    uVar21 = (undefined4)uStack_80;
    uVar22 = uStack_80._4_4_;
LAB_005779e0:
    __return_storage_ptr__->r = iVar19;
    __return_storage_ptr__->c = iVar9;
    *(undefined4 *)&__return_storage_ptr__->i = uVar21;
    *(undefined4 *)((long)&__return_storage_ptr__->i + 4) = uVar22;
    goto LAB_00577c84;
  }
  QListViewPrivate::closestIndex
            (__return_storage_ptr__,this_00,(QRect *)local_98,(QList<QModelIndex> *)&local_68);
LAB_00577c84:
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,0x18,0x10);
    }
  }
LAB_005771f2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QListView::moveCursor(CursorAction cursorAction, Qt::KeyboardModifiers modifiers)
{
    Q_D(QListView);
    Q_UNUSED(modifiers);

    auto findAvailableRowBackward = [d](int row) {
        while (row >= 0 && d->isHiddenOrDisabled(row))
            --row;
        return row;
    };

    auto findAvailableRowForward = [d](int row) {
        int rowCount = d->model->rowCount(d->root);
        if (!rowCount)
            return -1;
        while (row < rowCount && d->isHiddenOrDisabled(row))
            ++row;
        if (row >= rowCount)
            return -1;
        return row;
    };

    QModelIndex current = currentIndex();
    if (!current.isValid()) {
        int row = findAvailableRowForward(0);
        if (row == -1)
            return QModelIndex();
        return d->model->index(row, d->column, d->root);
    }

    if ((d->flow == LeftToRight && cursorAction == MoveLeft) ||
            (d->flow == TopToBottom && (cursorAction == MoveUp || cursorAction == MovePrevious))) {
        const int row = findAvailableRowBackward(current.row() - 1);
        if (row == -1)
            return current;
        return d->model->index(row, d->column, d->root);
    } else if ((d->flow == LeftToRight && cursorAction == MoveRight) ||
               (d->flow == TopToBottom && (cursorAction == MoveDown || cursorAction == MoveNext))) {
        const int row = findAvailableRowForward(current.row() + 1);
        if (row == -1)
            return current;
        return d->model->index(row, d->column, d->root);
    }

    const QRect initialRect = rectForIndex(current);
    QRect rect = initialRect;
    if (rect.isEmpty()) {
        return d->model->index(0, d->column, d->root);
    }
    if (d->gridSize().isValid()) rect.setSize(d->gridSize());

    QSize contents = d->contentsSize();
    QList<QModelIndex> intersectVector;

    switch (cursorAction) {
    case MoveLeft:
        while (intersectVector.isEmpty()) {
            rect.translate(-rect.width(), 0);
            if (rect.right() <= 0)
                return current;
            if (rect.left() < 0)
                rect.setLeft(0);
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MoveRight:
        while (intersectVector.isEmpty()) {
            rect.translate(rect.width(), 0);
            if (rect.left() >= contents.width())
                return current;
            if (rect.right() > contents.width())
                rect.setRight(contents.width());
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MovePageUp: {
        if (rect.height() >= d->viewport->height())
           return moveCursor(QAbstractItemView::MoveUp, modifiers);

        rect.moveTop(rect.top() - d->viewport->height() + 1);
        if (rect.top() < rect.height()) {
            rect.setTop(0);
            rect.setBottom(1);
        }
        QModelIndex findindex = current;
        while (intersectVector.isEmpty()
               || rectForIndex(findindex).top() <= (rectForIndex(current).bottom() - d->viewport->rect().height())
               || rect.top() <= 0) {
            rect.translate(0, 1);
            if (rect.bottom() <= 0) {
                return current;
            }
            intersectVector = d->intersectingSet(rect);
            findindex = d->closestIndex(initialRect, intersectVector);
        }
        return findindex;
    }
    case MovePrevious:
    case MoveUp:
        while (intersectVector.isEmpty()) {
            rect.translate(0, -rect.height());
            if (rect.bottom() <= 0) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    int row = d->batchStartRow() - 1;
                    while (row >= 0 && d->isHiddenOrDisabled(row))
                        --row;
                    if (row >= 0)
                        return d->model->index(row, d->column, d->root);
                }
#endif
                return current;
            }
            if (rect.top() < 0)
                rect.setTop(0);
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MovePageDown: {
        if (rect.height() >= d->viewport->height())
           return moveCursor(QAbstractItemView::MoveDown, modifiers);

        rect.moveTop(rect.top() + d->viewport->height() - 1);
        if (rect.bottom() > contents.height() - rect.height()) {
            rect.setTop(contents.height() - 1);
            rect.setBottom(contents.height());
        }
        QModelIndex index = current;
        // index's bottom() - current's top() always <=  (d->viewport->rect().height()
        while (intersectVector.isEmpty()
               || rectForIndex(index).bottom() >= (d->viewport->rect().height() + rectForIndex(current).top())
               || rect.bottom() > contents.height()) {
            rect.translate(0, -1);
            if (rect.top() >= contents.height()) {
                return current;
            }
            intersectVector = d->intersectingSet(rect);
            index = d->closestIndex(initialRect, intersectVector);
        }
        return index;
    }
    case MoveNext:
    case MoveDown:
        while (intersectVector.isEmpty()) {
            rect.translate(0, rect.height());
            if (rect.top() >= contents.height()) {
#ifdef QT_KEYPAD_NAVIGATION
                if (QApplicationPrivate::keypadNavigationEnabled()) {
                    int rowCount = d->model->rowCount(d->root);
                    int row = 0;
                    while (row < rowCount && d->isHiddenOrDisabled(row))
                        ++row;
                    if (row < rowCount)
                        return d->model->index(row, d->column, d->root);
                }
#endif
                return current;
            }
            if (rect.bottom() > contents.height())
                rect.setBottom(contents.height());
            intersectVector = d->intersectingSet(rect);
            d->removeCurrentAndDisabled(&intersectVector, current);
        }
        return d->closestIndex(initialRect, intersectVector);
    case MoveHome:
        return d->model->index(0, d->column, d->root);
    case MoveEnd:
        return d->model->index(d->batchStartRow() - 1, d->column, d->root);}

    return current;
}